

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

int __thiscall RenX::Server::kill(Server *this,__pid_t __pid,int __sig)

{
  ssize_t sVar1;
  size_t in_RCX;
  int iVar2;
  int in_R8D;
  string local_30;
  
  if (this->m_competitive == false) {
    string_printf_abi_cxx11_(&local_30,"kill pid%d",__pid);
    sVar1 = send(this,(int)local_30._M_string_length,local_30._M_dataplus._M_p,in_RCX,in_R8D);
    iVar2 = (int)CONCAT71((int7)((ulong)this >> 8),0 < (int)sVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

bool RenX::Server::kill(int id) {
	return m_competitive == false && send(string_printf("kill pid%d", id)) > 0;
}